

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O0

void __thiscall QNativeIpcKey::~QNativeIpcKey(QNativeIpcKey *this)

{
  bool bVar1;
  QNativeIpcKey *in_RDI;
  
  bVar1 = isSlowPath(in_RDI);
  if (bVar1) {
    destroy_internal(in_RDI);
  }
  QString::~QString((QString *)0x1ffa5a);
  return;
}

Assistant:

~QNativeIpcKey()
    {
        if (isSlowPath())
            destroy_internal();
    }